

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_task.cpp
# Opt level: O0

MPP_RET mpp_task_meta_get_packet(MppTask task,MppMetaKey key,MppPacket *packet)

{
  MPP_RET MVar1;
  MPP_RET ret;
  MppTaskImpl *impl;
  MppPacket *packet_local;
  MppMetaKey key_local;
  MppTask task_local;
  
  MVar1 = check_mpp_task_name(task);
  if (MVar1 == MPP_OK) {
    task_local._4_4_ = mpp_meta_get_packet(*(MppMeta *)((long)task + 0x28),key,packet);
    if (task_local._4_4_ != MPP_OK) {
      *packet = (MppPacket)0x0;
    }
  }
  else {
    task_local._4_4_ = MPP_NOK;
  }
  return task_local._4_4_;
}

Assistant:

MPP_RET mpp_task_meta_get_packet(MppTask task, MppMetaKey key, MppPacket *packet)
{
    if (check_mpp_task_name(task))
        return MPP_NOK;

    MppTaskImpl *impl = (MppTaskImpl *)task;
    MPP_RET ret = mpp_meta_get_packet(impl->meta, key, packet);
    if (ret)
        *packet = NULL;
    return ret;
}